

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_get_reply_to(PROPERTIES_HANDLE properties,AMQP_VALUE *reply_to_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  PROPERTIES_INSTANCE *properties_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *reply_to_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x3feb;
  }
  else {
    _item_count = reply_to_value;
    reply_to_value_local = &properties->composite_value;
    iVar1 = amqpvalue_get_composite_item_count
                      (properties->composite_value,(uint32_t *)&properties_instance);
    if (iVar1 == 0) {
      if ((uint)properties_instance < 5) {
        properties_instance._4_4_ = 0x3ff9;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(properties->composite_value,4);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          properties_instance._4_4_ = 0x4001;
        }
        else {
          *_item_count = value;
          properties_instance._4_4_ = 0;
        }
      }
    }
    else {
      properties_instance._4_4_ = 0x3ff3;
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_get_reply_to(PROPERTIES_HANDLE properties, AMQP_VALUE* reply_to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        if (amqpvalue_get_composite_item_count(properties_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(properties_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *reply_to_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}